

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QString * __thiscall
QFileSystemModelPrivate::name
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  Data *pDVar1;
  bool bVar2;
  QFileSystemNode *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QModelIndex::isValid(index);
  if (bVar2) {
    this_00 = node(this,index);
    bVar2 = QFileInfoGatherer::resolveSymlinks
                      ((QFileInfoGatherer *)
                       (this->fileInfoGatherer)._M_t.
                       super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                       .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl);
    if ((((bVar2) && (pDVar1 = (this->resolvedSymLinks).d, pDVar1 != (Data *)0x0)) &&
        (pDVar1->size != 0)) && (bVar2 = QFileSystemNode::isSymLink(this_00,true), bVar2)) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      filePath((QString *)&local_70,this,index);
      QDir::fromNativeSeparators((QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QHash<QString,_QString>::value
                (__return_storage_ptr__,&this->resolvedSymLinks,(QString *)&local_58,
                 &this_00->fileName);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)this_00);
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::name(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
    QFileSystemNode *dirNode = node(index);
    if (
#if QT_CONFIG(filesystemwatcher)
        fileInfoGatherer->resolveSymlinks() &&
#endif
        !resolvedSymLinks.isEmpty() && dirNode->isSymLink(/* ignoreNtfsSymLinks = */ true)) {
        QString fullPath = QDir::fromNativeSeparators(filePath(index));
        return resolvedSymLinks.value(fullPath, dirNode->fileName);
    }
    return dirNode->fileName;
}